

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URDFParsingUtils.h
# Opt level: O3

bool iDynTree::vector4FromString(string *vector_str,Vector4 *out)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  double *pdVar4;
  long *plVar5;
  long *plVar6;
  size_type *psVar7;
  ulong uVar8;
  ulong uVar9;
  undefined8 uVar10;
  _Alloc_hider _Var11;
  iterator iVar12;
  vector<double,_std::allocator<double>_> rgba;
  string errStr_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pieces;
  double newDouble;
  string errStr;
  double *local_298;
  iterator iStack_290;
  double *local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_258;
  long *local_240;
  long local_238;
  long local_230;
  long lStack_228;
  string *local_220;
  long *local_218;
  long local_210;
  long local_208;
  long lStack_200;
  long *local_1f8;
  long local_1f0;
  long local_1e8;
  long lStack_1e0;
  long *local_1d8 [2];
  long local_1c8 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1b8;
  long local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [7];
  ios_base local_138 [264];
  
  local_258.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_258.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_258.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_288 = (double *)0x0;
  local_298 = (double *)0x0;
  iStack_290._M_current = (double *)0x0;
  splitString(vector_str,&local_258);
  if (local_258.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_258.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    pdVar4 = (double *)0x0;
    iVar12._M_current = (double *)0x0;
  }
  else {
    uVar1 = 1;
    uVar9 = 0;
    local_220 = vector_str;
    do {
      uVar8 = uVar1;
      iVar3 = std::__cxx11::string::compare
                        ((char *)(local_258.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + uVar9));
      if (iVar3 != 0) {
        bVar2 = stringToDoubleWithClassicLocale
                          (local_258.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar9,(double *)&local_240);
        if (!bVar2) {
          std::operator+(&local_278,"Unable to parse component [",
                         local_258.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar9);
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_278);
          psVar7 = (size_type *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar7) {
            local_1a8[0]._0_8_ = *psVar7;
            local_1a8[0]._8_8_ = plVar5[3];
            local_1b8 = local_1a8;
          }
          else {
            local_1a8[0]._0_8_ = *psVar7;
            local_1b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar5;
          }
          local_1b0 = plVar5[1];
          *plVar5 = (long)psVar7;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_dataplus._M_p != &local_278.field_2) {
            operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
          }
          iDynTree::reportError("","vector4FromString",local_1b8->_M_local_buf);
          uVar10 = local_1a8[0]._M_allocated_capacity;
          _Var11._M_p = (pointer)local_1b8;
          if (local_1b8 != local_1a8) goto LAB_00134903;
          goto LAB_0013490b;
        }
        if (iStack_290._M_current == local_288) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)&local_298,iStack_290,
                     (double *)&local_240);
        }
        else {
          *iStack_290._M_current = (double)local_240;
          iStack_290._M_current = iStack_290._M_current + 1;
        }
      }
      pdVar4 = local_298;
      vector_str = local_220;
      uVar1 = (ulong)((int)uVar8 + 1);
      uVar9 = uVar8;
      iVar12._M_current = iStack_290._M_current;
    } while (uVar8 < (ulong)((long)local_258.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_258.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  if ((long)iVar12._M_current - (long)pdVar4 == 0x20) {
    out->m_data[0] = *pdVar4;
    out->m_data[1] = pdVar4[1];
    out->m_data[2] = pdVar4[2];
    out->m_data[3] = pdVar4[3];
    bVar2 = true;
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
    std::ios_base::~ios_base(local_138);
    plVar5 = (long *)std::__cxx11::string::replace((ulong)local_1d8,0,(char *)0x0,0x137ff6);
    plVar6 = plVar5 + 2;
    if ((long *)*plVar5 == plVar6) {
      local_208 = *plVar6;
      lStack_200 = plVar5[3];
      local_218 = &local_208;
    }
    else {
      local_208 = *plVar6;
      local_218 = (long *)*plVar5;
    }
    local_210 = plVar5[1];
    *plVar5 = (long)plVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_218);
    plVar6 = plVar5 + 2;
    if ((long *)*plVar5 == plVar6) {
      local_1e8 = *plVar6;
      lStack_1e0 = plVar5[3];
      local_1f8 = &local_1e8;
    }
    else {
      local_1e8 = *plVar6;
      local_1f8 = (long *)*plVar5;
    }
    local_1f0 = plVar5[1];
    *plVar5 = (long)plVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_1f8,(ulong)(vector_str->_M_dataplus)._M_p);
    plVar6 = plVar5 + 2;
    if ((long *)*plVar5 == plVar6) {
      local_230 = *plVar6;
      lStack_228 = plVar5[3];
      local_240 = &local_230;
    }
    else {
      local_230 = *plVar6;
      local_240 = (long *)*plVar5;
    }
    local_238 = plVar5[1];
    *plVar5 = (long)plVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_240);
    psVar7 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_278.field_2._M_allocated_capacity = *psVar7;
      local_278.field_2._8_8_ = plVar5[3];
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    }
    else {
      local_278.field_2._M_allocated_capacity = *psVar7;
      local_278._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_278._M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if (local_240 != &local_230) {
      operator_delete(local_240,local_230 + 1);
    }
    if (local_1f8 != &local_1e8) {
      operator_delete(local_1f8,local_1e8 + 1);
    }
    if (local_218 != &local_208) {
      operator_delete(local_218,local_208 + 1);
    }
    if (local_1d8[0] != local_1c8) {
      operator_delete(local_1d8[0],local_1c8[0] + 1);
    }
    iDynTree::reportError("","vector4FromString",local_278._M_dataplus._M_p);
    uVar10 = local_278.field_2._M_allocated_capacity;
    _Var11._M_p = local_278._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
LAB_00134903:
      operator_delete(_Var11._M_p,uVar10 + 1);
    }
LAB_0013490b:
    bVar2 = false;
  }
  if (local_298 != (double *)0x0) {
    operator_delete(local_298,(long)local_288 - (long)local_298);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_258);
  return bVar2;
}

Assistant:

bool inline vector4FromString(const std::string & vector_str, Vector4 & out)
{
    std::vector<std::string> pieces;
    std::vector<double> rgba;
    splitString(vector_str,pieces);
    for (unsigned int i = 0; i < pieces.size(); ++i)
    {
      if (pieces[i] != ""){
       double newDouble;
       if( stringToDoubleWithClassicLocale(pieces[i],newDouble) )
       {
          rgba.push_back(newDouble);
       }
       else
       {
           std::string errStr = "Unable to parse component [" + pieces[i] + "] to a double (while parsing a vector value)";
           reportError("","vector4FromString",errStr.c_str());
           return false;
       }
      }
    }

    if (rgba.size() != 4)
    {
        std::string errStr = "Parser found " + intToString(rgba.size())  + " elements but 4 expected while parsing vector [" + vector_str + "]";
        reportError("","vector4FromString",errStr.c_str());
        return false;
    }

    out(0) = rgba[0];
    out(1) = rgba[1];
    out(2) = rgba[2];
    out(3) = rgba[3];

    return true;
}